

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::XMLReader::getQName(XMLReader *this,XMLBuffer *toFill,int *colonPosition)

{
  XMLSize_t XVar1;
  bool bVar2;
  
  bVar2 = getNCName(this,toFill);
  if (!bVar2) {
    *colonPosition = -1;
    return false;
  }
  if (((this->fCharIndex != this->fCharsAvail) || (bVar2 = refreshCharBuffer(this), bVar2)) &&
     (this->fCharBuf[this->fCharIndex] == L':')) {
    XVar1 = toFill->fIndex;
    *colonPosition = (int)XVar1;
    if (XVar1 == toFill->fCapacity) {
      XMLBuffer::ensureCapacity(toFill,1);
    }
    XVar1 = toFill->fIndex;
    toFill->fIndex = XVar1 + 1;
    toFill->fBuffer[XVar1] = L':';
    this->fCharIndex = this->fCharIndex + 1;
    this->fCurCol = this->fCurCol + 1;
    bVar2 = getNCName(this,toFill);
    return bVar2;
  }
  *colonPosition = -1;
  return true;
}

Assistant:

bool XMLReader::getQName(XMLBuffer& toFill, int* colonPosition)
{
    // We are only looking for two iterations (i.e. 'NCNAME':'NCNAME').
    // We will stop when we finished scanning for a QName (i.e. either a second
    // colon or an invalid char).
    if(!getNCName(toFill))
    {
        *colonPosition = -1;
        return false;
    }
    if (fCharIndex == fCharsAvail && !refreshCharBuffer())
    {
        *colonPosition = -1;
        return true;
    }
    if (fCharBuf[fCharIndex] != chColon)
    {
        *colonPosition = -1;
        return true;
    }

    *colonPosition = (int)toFill.getLen();
    toFill.append(chColon);
    fCharIndex++;
    fCurCol++;
    return getNCName(toFill);
}